

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O2

bool __thiscall
QPDFNameTreeObjectHelper::findObject
          (QPDFNameTreeObjectHelper *this,string *name,QPDFObjectHandle *oh)

{
  bool bVar1;
  iterator i;
  iterator iStack_a8;
  iterator local_60;
  
  find(&iStack_a8,this,name,false);
  end(&local_60,this);
  bVar1 = NNTreeIterator::operator==
                    (iStack_a8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,local_60.impl.
                            super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iterator::~iterator(&local_60);
  if (!bVar1) {
    iterator::updateIValue(&iStack_a8);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)oh,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&iStack_a8.ivalue.second);
  }
  iterator::~iterator(&iStack_a8);
  return !bVar1;
}

Assistant:

bool
QPDFNameTreeObjectHelper::findObject(std::string const& name, QPDFObjectHandle& oh)
{
    auto i = find(name);
    if (i == end()) {
        return false;
    }
    oh = i->second;
    return true;
}